

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall
AccelParam::StartAccel
          (AccelParam *this,double _startSpeed,double _targetSpeed,double _accel,double _startTime)

{
  uint uVar1;
  AccelParam *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double local_38;
  
  if (in_XMM2_Qa <= 0.0) {
    if (in_XMM0_Qa <= in_XMM1_Qa) {
      return;
    }
  }
  else if (in_XMM1_Qa <= in_XMM0_Qa) {
    return;
  }
  SetSpeed(in_RDI,in_XMM0_Qa);
  in_RDI->startSpeed = in_XMM0_Qa;
  in_RDI->targetSpeed = in_XMM1_Qa;
  in_RDI->acceleration = in_XMM2_Qa;
  uVar1 = std::isnan(in_XMM3_Qa);
  local_38 = in_XMM3_Qa;
  if ((uVar1 & 1) != 0) {
    local_38 = currCycle.simTime;
  }
  in_RDI->accelStartTime = local_38;
  in_RDI->startTime = local_38;
  in_RDI->targetTime =
       in_RDI->startTime + (in_RDI->targetSpeed - in_RDI->startSpeed) / in_RDI->acceleration;
  dVar2 = getDeltaDist((AccelParam *)_accel,_startTime);
  in_RDI->targetDeltaDist = dVar2;
  return;
}

Assistant:

void AccelParam::StartAccel(double _startSpeed, double _targetSpeed,
                            double _accel, double _startTime)
{
    // Sanity check
    if (!(_accel > 0 ? _targetSpeed > _startSpeed : _targetSpeed < _startSpeed))
        return;
    
    // reset
    SetSpeed(_startSpeed);
    
    // set values
    startSpeed = _startSpeed;
    targetSpeed = _targetSpeed;
    acceleration = _accel;
    startTime = accelStartTime = std::isnan(_startTime) ? currCycle.simTime : _startTime;

    // pre-calculate the target delta distance, needed for ratio-calculation
    targetTime = startTime + (targetSpeed - startSpeed)/acceleration;
    targetDeltaDist = getDeltaDist(targetTime);
}